

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_subscript(char *pre,int ndim,int *subscript,char *post)

{
  undefined8 in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  int i;
  int local_24;
  
  printf("%s [",in_RDI);
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    printf("%d",(ulong)*(uint *)(in_RDX + (long)local_24 * 4));
    if (local_24 == in_ESI + -1) {
      printf("] %s",in_RCX);
    }
    else {
      printf(",");
    }
  }
  return;
}

Assistant:

void print_subscript(char *pre,int ndim, int subscript[], char* post)
{
    int i;

    printf("%s [",pre);
    for(i=0;i<ndim;i++){
        printf("%d",subscript[i]);
        if(i==ndim-1)printf("] %s",post);
        else printf(",");
    }
}